

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O0

int messagesender_close(MESSAGE_SENDER_HANDLE message_sender)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  MESSAGE_SENDER_HANDLE message_sender_local;
  
  if (message_sender == (MESSAGE_SENDER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_sender.c"
                ,"messagesender_close",0x34b,1,"NULL message_sender");
    }
    l._4_4_ = 0x34c;
  }
  else {
    indicate_all_messages_as_error(message_sender);
    if ((message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPENING) ||
       (message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPEN)) {
      set_message_sender_state(message_sender,MESSAGE_SENDER_STATE_CLOSING);
      iVar1 = link_detach(message_sender->link,true,(char *)0x0,(char *)0x0,(AMQP_VALUE)0x0);
      if (iVar1 == 0) {
        l._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_sender.c"
                    ,"messagesender_close",0x358,1,"Detaching link failed");
        }
        l._4_4_ = 0x359;
        set_message_sender_state(message_sender,MESSAGE_SENDER_STATE_ERROR);
      }
    }
    else {
      l._4_4_ = 0;
    }
  }
  return l._4_4_;
}

Assistant:

int messagesender_close(MESSAGE_SENDER_HANDLE message_sender)
{
    int result;

    if (message_sender == NULL)
    {
        LogError("NULL message_sender");
        result = MU_FAILURE;
    }
    else
    {
        indicate_all_messages_as_error(message_sender);

        if ((message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPENING) ||
            (message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPEN))
        {
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_CLOSING);
            if (link_detach(message_sender->link, true, NULL, NULL, NULL) != 0)
            {
                LogError("Detaching link failed");
                result = MU_FAILURE;
                set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_ERROR);
            }
            else
            {
                result = 0;
            }
        }
        else
        {
            result = 0;
        }
    }

    return result;
}